

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O1

void __thiscall
cppmetrics::ExponentiallyDecayingReservoir::update(ExponentiallyDecayingReservoir *this,long value)

{
  atomic_long *paVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  random_device *__urng;
  mapped_type *this_00;
  map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  *this_01;
  double dVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>,_bool> pVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::_Rb_tree_iterator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  pVar6;
  double priority;
  double smallest_priority;
  double local_68;
  double local_60;
  double local_58;
  pair<double,_cppmetrics::WeightedSample> local_50;
  WeightedSample local_38;
  
  rescale_if_needed(this);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar3 == 0) {
    iVar3 = (*this->m_clock->_vptr_Clock[1])();
    local_60 = exp((double)(CONCAT44(extraout_var,iVar3) - this->m_start) * this->m_alpha);
    __urng = (random_device *)__tls_get_addr(&PTR_00120f10);
    if (__urng[1].field_0.field2[0x10] == '\0') {
      update();
    }
    if (__urng[1].field_0.field2[0x10] == '\0') {
      update();
    }
    dVar4 = std::generate_canonical<double,53ul,std::random_device>(__urng);
    local_68 = local_60 /
               (dVar4 * (*(double *)((long)&__urng[1].field_0 + 8) - *(double *)&__urng[1].field_0)
               + *(double *)&__urng[1].field_0);
    LOCK();
    paVar1 = &this->m_count;
    lVar2 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    if (this->m_size < lVar2 + 1U) {
      local_58 = *(double *)
                  ((this->m_samples)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      if (local_58 < local_68) {
        WeightedSample::WeightedSample(&local_38,value,local_60);
        local_50.first = local_68;
        WeightedSample::WeightedSample(&local_50.second,&local_38);
        this_01 = &this->m_samples;
        pVar5 = std::
                _Rb_tree<double,std::pair<double_const,cppmetrics::WeightedSample>,std::_Select1st<std::pair<double_const,cppmetrics::WeightedSample>>,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
                ::_M_emplace_unique<std::pair<double,cppmetrics::WeightedSample>>
                          ((_Rb_tree<double,std::pair<double_const,cppmetrics::WeightedSample>,std::_Select1st<std::pair<double_const,cppmetrics::WeightedSample>>,std::less<double>,std::allocator<std::pair<double_const,cppmetrics::WeightedSample>>>
                            *)this_01,&local_50);
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pVar6 = std::
                  _Rb_tree<double,_std::pair<const_double,_cppmetrics::WeightedSample>,_std::_Select1st<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
                  ::equal_range(&this_01->_M_t,&local_58);
          std::
          _Rb_tree<double,_std::pair<const_double,_cppmetrics::WeightedSample>,_std::_Select1st<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
          ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar6.first._M_node,
                         (_Base_ptr)pVar6.second._M_node);
        }
      }
    }
    else {
      WeightedSample::WeightedSample((WeightedSample *)&local_50,value,local_60);
      this_00 = std::
                map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
                ::operator[](&this->m_samples,&local_68);
      WeightedSample::operator=(this_00,(WeightedSample *)&local_50);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void ExponentiallyDecayingReservoir::update(long value)
{
  rescale_if_needed();

  std::lock_guard<std::mutex> lock(m_mutex);

  auto now = m_clock->now_as_time_t();
  auto scale_factor = now - m_start;
  double item_weight = std::exp(m_alpha * scale_factor);
  double priority = item_weight / dist(rd);
  
  auto new_size = m_count.fetch_add(1) + 1;
  if (new_size <= m_size)
  {
    m_samples[priority] = WeightedSample{value, item_weight};
  }
  else
  {
    const auto& smallest_pair = *m_samples.begin();
    double smallest_priority = smallest_pair.first;
    if (smallest_priority < priority)
    {
      auto insert_result = m_samples.insert(std::make_pair(priority, WeightedSample{value, item_weight}));
      bool did_insert = insert_result.second;
      if (did_insert)
      {
        m_samples.erase(smallest_priority);
      }
    }
  }
}